

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O2

vector<short,_std::allocator<short>_> *
cppqc::shrinkIntegral<short>(vector<short,_std::allocator<short>_> *__return_storage_ptr__,short x)

{
  short sVar1;
  short n;
  short local_1e;
  short local_1c [2];
  
  (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar1 = x;
  if (x < 0) {
    local_1c[0] = -x;
    std::vector<short,_std::allocator<short>_>::emplace_back<short>(__return_storage_ptr__,local_1c)
    ;
  }
  for (; sVar1 != 0; sVar1 = sVar1 / 2) {
    local_1e = x - sVar1;
    std::vector<short,_std::allocator<short>_>::emplace_back<short>
              (__return_storage_ptr__,&local_1e);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Integral> shrinkIntegral(Integral x) {
  std::vector<Integral> ret;
  if (std::numeric_limits<Integral>::is_signed && x < 0) {
    if (x == std::numeric_limits<Integral>::min()) {
      ret.push_back(std::numeric_limits<Integral>::max());
    } else {
      assert(-x > 0);
      ret.push_back(-x);
    }
  }

  for (Integral n = x; n != 0; n /= 2)
    ret.push_back(x - n);
  return ret;
}